

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O1

void draw_round_arrow(Fl_Color c,float da)

{
  Fl_Color FVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar5 = 0;
  do {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,c);
    if (iVar5 == 0) {
      lVar2 = 0x130;
    }
    else {
      FVar1 = fl_color_average(c,0x38,0.67);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar1);
      lVar2 = 0xd0;
    }
    (**(code **)((long)(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device + lVar2))();
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbfb999999999999a,0);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbff0000000000000,0);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
              (0xbff0000000000000,0x3feccccccccccccd);
    uVar3 = 0x1c;
    dVar9 = 140.0;
    dVar10 = 1.0;
    do {
      dVar7 = (dVar9 / 180.0) * 3.141592653589793;
      dVar8 = cos(dVar7);
      dVar7 = sin(dVar7);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(dVar8 * dVar10,dVar7 * dVar10);
      dVar9 = dVar9 - (double)da;
      dVar10 = dVar10 + -0.005;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    iVar4 = -0x1c;
    do {
      dVar7 = (dVar9 / 180.0) * 3.141592653589793;
      dVar8 = cos(dVar7);
      dVar7 = sin(dVar7);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(dVar8 * dVar10,dVar7 * dVar10);
      dVar9 = dVar9 + (double)da;
      dVar10 = dVar10 + -0.015;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[(ulong)(iVar5 == 0) * 4 + 0x24])();
    bVar6 = iVar5 == 0;
    iVar5 = iVar5 + 1;
  } while (bVar6);
  return;
}

Assistant:

static void draw_round_arrow(Fl_Color c, float da=5.0) {
  double a, r, dr1=0.005, dr2=0.015;
  int i, j;
  for (j=0; j<2; j++) {
    if (j&1) {
      fl_color(c);
      set_outline_color(c);
      BC;
    } else {
      fl_color(c);
      BCP;
    }
    vv(-0.1, 0.0);
    vv(-1.0, 0.0);
    vv(-1.0, 0.9);
    for (i=27, a=140.0, r=1.0; i>0; i--, a-=da, r-=dr1) {
      double ar = a/180.0 * M_PI;
      vv(cos(ar)*r, sin(ar)*r);
    }
    for (i=27; i>=0; a+=da, i--, r-=dr2) {
      double ar = a/180.0 * M_PI;
      vv(cos(ar)*r, sin(ar)*r);
    }
    if (j&1) {
      EC;
    } else {
      ECP;
    }
  }
}